

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_server.cpp
# Opt level: O3

int main(void)

{
  CppNet net;
  _Any_data local_48;
  undefined1 local_38 [16];
  CppNet local_28;
  
  local_28._cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28._cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cppnet::CppNet::Init(&local_28,1);
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = ConnectFunc;
  local_38._8_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
       ::_M_invoke;
  local_38._0_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
       ::_M_manager;
  cppnet::CppNet::SetAcceptCallback(&local_28,(connect_call_back *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = ReadFunc;
  local_38._8_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>
       ::_M_invoke;
  local_38._0_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>
       ::_M_manager;
  cppnet::CppNet::SetReadCallback(&local_28,(read_call_back *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._M_unused._M_object = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0.0.0.0","");
  cppnet::CppNet::ListenAndAccept(&local_28,(string *)&local_48,0x22d9);
  if ((undefined1 *)local_48._M_unused._0_8_ != local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  local_48._M_unused._M_object = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0.0.0.0","");
  cppnet::CppNet::ListenAndAccept(&local_28,(string *)&local_48,0x22da);
  if ((undefined1 *)local_48._M_unused._0_8_ != local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  cppnet::CppNet::Join(&local_28);
  cppnet::CppNet::~CppNet(&local_28);
  return 0;
}

Assistant:

int main() {

    cppnet::CppNet net;
    net.Init(1);

    net.SetAcceptCallback(ConnectFunc);
    net.SetReadCallback(ReadFunc);

    net.ListenAndAccept("0.0.0.0", 8921);
    net.ListenAndAccept("0.0.0.0", 8922);

    net.Join();
}